

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleGetTexLevelParameterifvTests.cpp
# Opt level: O0

void __thiscall
glcts::MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest::deinit
          (MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0xb8))(0x9100,0);
  (**(code **)(lVar3 + 0x480))(1,&this->to_id);
  this->to_id = 0;
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"Texture object deletion failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGetTexLevelParameterifvTests.cpp"
                  ,0x513);
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

void MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind default texture object to GL_TEXTURE_2D_MULTISAMPLE texture target. */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);

	/* Delete texture object. */
	gl.deleteTextures(1, &to_id);

	to_id = 0;

	/* Check if no error was generated. */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture object deletion failed.");

	/* Call base class' deinit() */
	TestCase::deinit();
}